

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbuffer.c
# Opt level: O3

void bounded_buffer_put(bounded_buffer_t *bb,entry_t *item)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  int iVar2;
  
  __mutex = &bb->lock;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  iVar2 = bb->size;
  iVar1 = bb->tail;
  if (iVar2 <= iVar1 - bb->head) {
    do {
      pthread_cond_wait((pthread_cond_t *)&bb->has_space,(pthread_mutex_t *)__mutex);
      iVar2 = bb->size;
      iVar1 = bb->tail;
    } while (iVar2 <= iVar1 - bb->head);
  }
  bb->tail = iVar1 + 1;
  bb->entries[iVar1 % iVar2] = item;
  pthread_cond_signal((pthread_cond_t *)&bb->has_items);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void bounded_buffer_put(bounded_buffer_t* bb, entry_t* item)
{
    pthread_mutex_lock(&bb->lock);

    while (bb->tail - bb->head >= bb->size)
    {
        pthread_cond_wait(&bb->has_space, &bb->lock);
    }

    bb->entries[bb->tail++ % bb->size] = item;
    pthread_cond_signal(&bb->has_items);

    pthread_mutex_unlock(&bb->lock);
}